

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O1

void __thiscall QTableWidget::dropEvent(QTableWidget *this,QDropEvent *event)

{
  long *plVar1;
  char cVar2;
  DragDropMode DVar3;
  QTableWidget *pQVar4;
  iterator iVar5;
  QModelIndex *index;
  int *piVar6;
  int iVar7;
  int row_00;
  QModelIndex *index_1;
  int *piVar8;
  QModelIndex *index_2;
  int column;
  int iVar9;
  long in_FS_OFFSET;
  int row;
  int col;
  QList<QTableWidgetItem_*> local_98;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 *local_68;
  int local_60;
  int local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  QTableWidgetItem *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)&(this->super_QTableView).super_QAbstractItemView.super_QAbstractScrollArea.
                      super_QFrame.super_QWidget.field_0x8;
  pQVar4 = (QTableWidget *)QDropEvent::source();
  if ((pQVar4 == this) &&
     ((*(int *)(event + 0x2c) == 2 ||
      (DVar3 = QAbstractItemView::dragDropMode((QAbstractItemView *)this), DVar3 == InternalMove))))
  {
    local_58 = 0xffffffffffffffff;
    uStack_50 = 0;
    local_48 = 0;
    local_5c = -1;
    local_60 = -1;
    if ((event[0xc] == (QDropEvent)0x0) &&
       (((cVar2 = (**(code **)(*plVar1 + 0x110))(plVar1,event,&local_60,&local_5c,&local_58),
         cVar2 != '\0' && (local_60 == -1)) && (local_5c == -1)))) {
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = 0xaaaaaaaa;
      uStack_74 = 0xaaaaaaaa;
      uStack_70 = 0xaaaaaaaa;
      uStack_6c = 0xaaaaaaaa;
      (**(code **)(*(long *)&(this->super_QTableView).super_QAbstractItemView.
                             super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x2d8))
                (&local_78,this);
      if (local_68 == (undefined1 *)0x0) {
        iVar9 = 0x7fffffff;
        iVar7 = 0x7fffffff;
      }
      else {
        piVar6 = (int *)CONCAT44(uStack_6c,uStack_70);
        piVar8 = piVar6 + (long)local_68 * 6;
        iVar7 = 0x7fffffff;
        iVar9 = 0x7fffffff;
        do {
          if (*piVar6 < iVar7) {
            iVar7 = *piVar6;
          }
          if (piVar6[1] < iVar9) {
            iVar9 = piVar6[1];
          }
          piVar6 = piVar6 + 6;
        } while (piVar6 != piVar8);
      }
      local_98.d.d = (Data *)0x0;
      local_98.d.ptr = (QTableWidgetItem **)0x0;
      local_98.d.size = 0;
      QList<QTableWidgetItem_*>::reserve(&local_98,(long)(int)local_68);
      if (local_68 != (undefined1 *)0x0) {
        piVar8 = (int *)CONCAT44(uStack_6c,uStack_70);
        piVar6 = piVar8 + (long)local_68 * 6;
        do {
          local_40 = takeItem(this,*piVar8,piVar8[1]);
          QtPrivate::QPodArrayOps<QTableWidgetItem*>::emplace<QTableWidgetItem*&>
                    ((QPodArrayOps<QTableWidgetItem*> *)&local_98,local_98.d.size,&local_40);
          QList<QTableWidgetItem_*>::end(&local_98);
          piVar8 = piVar8 + 6;
        } while (piVar8 != piVar6);
      }
      if (local_68 != (undefined1 *)0x0) {
        piVar6 = (int *)CONCAT44(uStack_6c,uStack_70);
        piVar8 = piVar6 + (long)local_68 * 6;
        do {
          row_00 = (*piVar6 - iVar7) + (int)local_58;
          column = (piVar6[1] - iVar9) + local_58._4_4_;
          iVar5 = QList<QTableWidgetItem_*>::begin(&local_98);
          local_98.d.ptr = local_98.d.ptr + 1;
          local_98.d.size = local_98.d.size + -1;
          setItem(this,row_00,column,*iVar5.i);
          piVar6 = piVar6 + 6;
        } while (piVar6 != piVar8);
      }
      event[0xc] = (QDropEvent)0x1;
      if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,8,0x10);
        }
      }
      piVar8 = (int *)CONCAT44(uStack_74,local_78);
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_74,local_78),0x18,0x10);
        }
      }
    }
    if (event[0xc] == (QDropEvent)0x1) {
      *(undefined1 *)((long)plVar1 + 0x3e5) = 1;
    }
  }
  QTableView::dropEvent(&this->super_QTableView,event);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableWidget::dropEvent(QDropEvent *event) {
    Q_D(QTableWidget);
    if (event->source() == this && (event->dropAction() == Qt::MoveAction ||
                                    dragDropMode() == QAbstractItemView::InternalMove)) {
        QModelIndex topIndex;
        int col = -1;
        int row = -1;
        // check whether a subclass has already accepted the event, ie. moved the data
        if (!event->isAccepted() && d->dropOn(event, &row, &col, &topIndex) && row == -1 && col == -1) {
            // Drop onto item
            const QModelIndexList indexes = selectedIndexes();
            int top = INT_MAX;
            int left = INT_MAX;
            for (const auto &index : indexes) {
                top = qMin(index.row(), top);
                left = qMin(index.column(), left);
            }
            QList<QTableWidgetItem *> taken;
            const int indexesCount = indexes.size();
            taken.reserve(indexesCount);
            for (const auto &index : indexes)
                taken.append(takeItem(index.row(), index.column()));

            for (const auto &index : indexes) {
                int r = index.row() - top + topIndex.row();
                int c = index.column() - left + topIndex.column();
                setItem(r, c, taken.takeFirst());
            }

            event->accept();
        }
        // either we or a subclass accepted the drop event, so assume that the data was
        // moved and that QAbstractItemView shouldn't remove the source when QDrag::exec returns
        if (event->isAccepted())
            d->dropEventMoved = true;
    }

    QTableView::dropEvent(event);
}